

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O0

bool __thiscall OpenMD::SelectionCompiler::clauseIndex(SelectionCompiler *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int second;
  int first;
  any intVal;
  int tok;
  int index;
  Token token;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  undefined5 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef5;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  SelectionCompiler *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  SelectionCompiler *in_stack_ffffffffffffff30;
  undefined4 local_28;
  undefined1 local_1;
  
  tokenNext((SelectionCompiler *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  if (local_28 == 2) {
    iVar2 = std::any_cast<int>((any *)CONCAT17(in_stack_fffffffffffffef7,
                                               CONCAT16(in_stack_fffffffffffffef6,
                                                        CONCAT15(in_stack_fffffffffffffef5,
                                                                 in_stack_fffffffffffffef0))));
    iVar3 = tokPeek(in_stack_fffffffffffffef8);
    if (iVar3 == 0x402) {
      tokenNext((SelectionCompiler *)CONCAT44(iVar2,in_stack_ffffffffffffff08));
      Token::~Token((Token *)0x37ef48);
      iVar3 = tokPeek(in_stack_fffffffffffffef8);
      if (iVar3 == 2) {
        tokenNext((SelectionCompiler *)CONCAT44(iVar2,in_stack_ffffffffffffff08));
        std::any::any((any *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                      (any *)in_stack_fffffffffffffef8);
        Token::~Token((Token *)0x37efe3);
        std::any::type((any *)in_stack_fffffffffffffef8);
        bVar1 = std::type_info::operator!=
                          ((type_info *)
                           CONCAT17(in_stack_fffffffffffffef7,
                                    CONCAT16(in_stack_fffffffffffffef6,
                                             CONCAT15(in_stack_fffffffffffffef5,
                                                      in_stack_fffffffffffffef0))),
                           (type_info *)
                           CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        if (bVar1) {
          local_1 = false;
        }
        else {
          std::any_cast<int>((any *)CONCAT17(in_stack_fffffffffffffef7,
                                             CONCAT16(in_stack_fffffffffffffef6,
                                                      CONCAT15(in_stack_fffffffffffffef5,
                                                               in_stack_fffffffffffffef0))));
          std::make_pair<int&,int&>
                    ((int *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                     (int *)0x37f05e);
          std::any::
          any<std::pair<int,int>,std::pair<int,int>,std::any::_Manager_internal<std::pair<int,int>>,void>
                    ((any *)CONCAT17(in_stack_fffffffffffffef7,
                                     CONCAT16(in_stack_fffffffffffffef6,
                                              CONCAT15(in_stack_fffffffffffffef5,
                                                       in_stack_fffffffffffffef0))),
                     (pair<int,_int> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
                    );
          Token::Token((Token *)CONCAT17(in_stack_fffffffffffffef7,
                                         CONCAT16(in_stack_fffffffffffffef6,
                                                  CONCAT15(in_stack_fffffffffffffef5,
                                                           in_stack_fffffffffffffef0))),
                       in_stack_fffffffffffffeec,(any *)0x37f094);
          local_1 = addTokenToPostfix((SelectionCompiler *)
                                      CONCAT17(in_stack_fffffffffffffef7,
                                               CONCAT16(in_stack_fffffffffffffef6,
                                                        CONCAT15(in_stack_fffffffffffffef5,
                                                                 in_stack_fffffffffffffef0))),
                                      (Token *)CONCAT44(in_stack_fffffffffffffeec,
                                                        in_stack_fffffffffffffee8));
          Token::~Token((Token *)0x37f0c2);
          std::any::~any((any *)0x37f0cc);
        }
        std::any::~any((any *)0x37f13c);
      }
      else {
        local_1 = numberExpected(in_stack_ffffffffffffff30);
      }
    }
    else {
      std::any::any<int&,int,std::any::_Manager_internal<int>,void>
                ((any *)CONCAT17(in_stack_fffffffffffffef7,
                                 CONCAT16(in_stack_fffffffffffffef6,
                                          CONCAT15(in_stack_fffffffffffffef5,
                                                   in_stack_fffffffffffffef0))),
                 (int *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      Token::Token((Token *)CONCAT17(in_stack_fffffffffffffef7,
                                     CONCAT16(in_stack_fffffffffffffef6,
                                              CONCAT15(in_stack_fffffffffffffef5,
                                                       in_stack_fffffffffffffef0))),
                   in_stack_fffffffffffffeec,(any *)0x37f17b);
      local_1 = addTokenToPostfix((SelectionCompiler *)
                                  CONCAT17(in_stack_fffffffffffffef7,
                                           CONCAT16(in_stack_fffffffffffffef6,
                                                    CONCAT15(in_stack_fffffffffffffef5,
                                                             in_stack_fffffffffffffef0))),
                                  (Token *)CONCAT44(in_stack_fffffffffffffeec,
                                                    in_stack_fffffffffffffee8));
      Token::~Token((Token *)0x37f1a9);
      std::any::~any((any *)0x37f1b3);
    }
  }
  else {
    local_1 = numberExpected(in_stack_ffffffffffffff30);
  }
  Token::~Token((Token *)0x37f235);
  return local_1;
}

Assistant:

bool SelectionCompiler::clauseIndex() {
    Token token = tokenNext();
    if (token.tok == Token::integer) {
      int index = std::any_cast<int>(token.value);
      int tok   = tokPeek();
      if (tok == Token::to) {
        tokenNext();
        tok = tokPeek();
        if (tok != Token::integer) { return numberExpected(); }

        std::any intVal = tokenNext().value;
        int first       = index;
        if (intVal.type() != typeid(int)) { return false; }
        int second = std::any_cast<int>(intVal);

        return addTokenToPostfix(
            Token(Token::index, std::any(std::make_pair(first, second))));

      } else {
        return addTokenToPostfix(Token(Token::index, std::any(index)));
      }
    } else {
      return numberExpected();
    }
  }